

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t cesu8_to_unicode(uint32_t *pwc,char *s,size_t n)

{
  uint32_t local_34;
  wchar_t local_30;
  uint32_t wc2;
  wchar_t cnt;
  uint32_t wc;
  size_t n_local;
  char *s_local;
  uint32_t *pwc_local;
  
  wc2 = 0;
  _cnt = n;
  n_local = (size_t)s;
  s_local = (char *)pwc;
  local_30 = _utf8_to_unicode(&wc2,s,n);
  if (((local_30 == L'\x03') && (0xd7ff < wc2)) && (wc2 < 0xdc00)) {
    local_34 = 0;
    if (((2 < _cnt - 3) &&
        (local_30 = _utf8_to_unicode(&local_34,(char *)(n_local + 3),_cnt - 3), local_30 == L'\x03')
        ) && ((0xdbff < local_34 && (local_34 < 0xe000)))) {
      wc2 = combine_surrogate_pair(wc2,local_34);
      local_30 = L'\x06';
LAB_001efd27:
      *(uint32_t *)s_local = wc2;
      return local_30;
    }
  }
  else if (((local_30 != L'\x03') || (wc2 < 0xdc00)) || (0xdfff < wc2)) goto LAB_001efd27;
  s_local[0] = -3;
  s_local[1] = -1;
  s_local[2] = '\0';
  s_local[3] = '\0';
  if (L'\0' < local_30) {
    local_30 = -local_30;
  }
  return local_30;
}

Assistant:

static int
cesu8_to_unicode(uint32_t *pwc, const char *s, size_t n)
{
	uint32_t wc = 0;
	int cnt;

	cnt = _utf8_to_unicode(&wc, s, n);
	if (cnt == 3 && IS_HIGH_SURROGATE_LA(wc)) {
		uint32_t wc2 = 0;
		if (n - 3 < 3) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		cnt = _utf8_to_unicode(&wc2, s+3, n-3);
		if (cnt != 3 || !IS_LOW_SURROGATE_LA(wc2)) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		wc = combine_surrogate_pair(wc, wc2);
		cnt = 6;
	} else if (cnt == 3 && IS_LOW_SURROGATE_LA(wc)) {
		/* Invalid byte sequence. */
		goto invalid_sequence;
	}
	*pwc = wc;
	return (cnt);
invalid_sequence:
	*pwc = UNICODE_R_CHAR;/* set the Replacement Character instead. */
	if (cnt > 0)
		cnt *= -1;
	return (cnt);
}